

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipstream.cpp
# Opt level: O1

void __thiscall ZipStream::ZipStream(ZipStream *this,string *zipName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  ushort uVar4;
  uint8_t *data;
  FILE *pFVar5;
  char *__s;
  size_t sVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  size_type sVar10;
  uint uVar11;
  char acStack_20098 [8];
  char fileName [65536];
  ushort uStack_10090;
  ushort uStack_1008e;
  undefined1 uStack_1008c;
  byte bStack_1008b;
  undefined2 uStack_1008a;
  uint t;
  ulong uStack_1007c;
  size_type sStack_10070;
  ulong uStack_10060;
  undefined1 local_86 [8];
  CentralDirEntry cd;
  ulong local_50;
  int64_t offset;
  uint local_3c;
  ulong uStack_38;
  uint32_t flags;
  
  paVar1 = &(this->zipName_).field_2;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zipName_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (zipName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->zipName_,pcVar2,pcVar2 + zipName->_M_string_length);
  (this->f_)._vptr_File = (_func_int **)&PTR__File_001b1870;
  (this->f_).fp_ = (FILE *)0x0;
  pFVar5 = fopen((zipName->_M_dataplus)._M_p,"rb");
  (this->f_).fp_ = (FILE *)pFVar5;
  fseek(pFVar5,-0x11,2);
  uVar11 = 0x10009;
  do {
    uVar11 = uVar11 - 1;
    fseek((FILE *)(this->f_).fp_,-5,1);
    fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
    if (CONCAT22(uStack_1008e,uStack_10090) == 0x6054b50) break;
  } while (1 < uVar11);
  pFVar5 = (FILE *)(this->f_).fp_;
  if ((int)uVar11 < 2) {
    if (pFVar5 != (FILE *)0x0) {
      fclose(pFVar5);
    }
    (this->f_).fp_ = (FILE *)0x0;
  }
  else {
    offset = (int64_t)paVar1;
    cd._38_8_ = ftell(pFVar5);
    fseek((FILE *)(this->f_).fp_,4,1);
    fread(&uStack_10090,1,2,(FILE *)(this->f_).fp_);
    uVar9 = (ulong)uStack_10090;
    fseek((FILE *)(this->f_).fp_,2,1);
    fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
    fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
    uVar11 = CONCAT22(uStack_1008e,uStack_10090);
    fread(&uStack_10090,1,2,(FILE *)(this->f_).fp_);
    uVar7 = (ulong)uStack_10090;
    if (uVar7 != 0) {
      uStack_38 = uVar9;
      __s = (char *)operator_new__(uVar7 + 1);
      memset(__s,0,uVar7 + 1);
      pcVar3 = (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = __s;
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
      }
      fread((this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl,1,uVar7,(FILE *)(this->f_).fp_);
      (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar7] = '\0';
      uVar9 = uStack_38;
    }
    uVar7 = (ulong)uVar11;
    if ((int)uVar9 == 0xffff || uVar11 == 0xffffffff) {
      fseek((FILE *)(this->f_).fp_,cd._38_8_ + -0x18,0);
      fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
      if (CONCAT22(uStack_1008e,uStack_10090) != 0x7064b50) {
        return;
      }
      fseek((FILE *)(this->f_).fp_,4,1);
      fread(&uStack_10090,1,8,(FILE *)(this->f_).fp_);
      fseek((FILE *)(this->f_).fp_,
            CONCAT26(uStack_1008a,
                     CONCAT15(bStack_1008b,
                              CONCAT14(uStack_1008c,CONCAT22(uStack_1008e,uStack_10090)))),0);
      fread(&uStack_10090,1,0x38,(FILE *)(this->f_).fp_);
      uVar9 = sStack_10070;
      uVar7 = uStack_10060;
    }
    std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>::reserve(&this->entries_,uVar9)
    ;
    fseek((FILE *)(this->f_).fp_,uVar7,0);
    if (0 < (long)uVar9) {
      sVar10 = 0;
      uStack_38 = uVar9;
      do {
        fread(local_86,1,0x2e,(FILE *)(this->f_).fp_);
        uVar9 = (ulong)(ushort)cd.compSize;
        sVar6 = fread(acStack_20098,1,uVar9,(FILE *)(this->f_).fp_);
        acStack_20098[sVar6] = '\0';
        fseek((FILE *)(this->f_).fp_,uVar9 - sVar6,1);
        uVar4 = cd.compSize._2_2_;
        local_50 = (ulong)(uint)cd._34_4_;
        uVar11 = (uint)cd.compSize._2_2_;
        memset(&uStack_10090,0,0x10003);
        if (uVar4 != 0) {
          do {
            fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
            fread(&uStack_1008c,1,(ulong)uStack_1008e,(FILE *)(this->f_).fp_);
            if (uStack_10090 == 0x7875) {
              uVar7 = (ulong)bStack_1008b;
              uVar9 = uVar7;
              if (uVar7 != 0) {
                do {
                  uVar9 = uVar9 - 1;
                } while ((char)uVar9 != '\0');
              }
              for (cVar8 = *(char *)((long)&uStack_1008a + uVar7); cVar8 != '\0'; cVar8 = cVar8 + -1
                  ) {
              }
              printf("UID %x GID %x\n");
            }
            else if (uStack_10090 != 0x5455) {
              if (uStack_10090 == 1) {
                local_50 = uStack_1007c;
              }
              else {
                printf("**Warning: Ignoring extra block %04x\n");
              }
            }
            uVar11 = (uVar11 - uStack_1008e) - 4;
          } while (0 < (int)uVar11);
        }
        fseek((FILE *)(this->f_).fp_,(ulong)(ushort)cd.uncompSize,1);
        local_3c = 0;
        std::vector<ZipStream::Entry,std::allocator<ZipStream::Entry>>::
        emplace_back<char(&)[65536],long&,unsigned_int_const&>
                  ((vector<ZipStream::Entry,std::allocator<ZipStream::Entry>> *)this,
                   (char (*) [65536])acStack_20098,(long *)&local_50,&local_3c);
        sVar10 = sVar10 + 1;
      } while (sVar10 != uStack_38);
    }
  }
  return;
}

Assistant:

ZipStream::ZipStream(const std::string& zipName)
    : zipName_(zipName), f_{zipName}
{
    uint32_t id = 0;
    // Find CD by scanning backwards from end
    f_.seek(-22 + 5, SEEK_END);
    int counter = 64 * 1024 + 8;
    while (id != EndOfCD_SIG && counter > 0) {
        f_.seek(-5, SEEK_CUR);
        id = f_.Read<uint32_t>();
        counter--;
    }
    if (counter <= 0) {
        f_.close();
        return;
    }

    auto start = f_.tell();
    f_.seek(4, SEEK_CUR);
    int64_t entryCount = f_.Read<uint16_t>();
    f_.seek(2, SEEK_CUR);
    /* auto cdSize = */ f_.Read<uint32_t>();
    int64_t cdOffset = f_.Read<uint32_t>();
    auto commentLen = f_.Read<uint16_t>();
    if (commentLen > 0) {
        comment_ = std::make_unique<char[]>(commentLen + 1);
        f_.Read(comment_.get(), commentLen);
        comment_[commentLen] = 0;
    }

    if (entryCount == 0xffff || cdOffset == 0xffffffff) {
        // Find zip64 data
        f_.seek(start - 6 * 4, SEEK_SET);
        id = f_.Read<uint32_t>();
        if (id != EndOfCD64Locator_SIG) {
            return;
        }
        f_.seek(4, SEEK_CUR);
        auto cdStart = f_.Read<int64_t>();
        f_.seek(cdStart, SEEK_SET);
        auto eocd64 = f_.Read<EndOfCentralDir64>();

        cdOffset = eocd64.cdoffset;
        entryCount = eocd64.entries;
    }

    entries_.reserve(entryCount);

    f_.seek(cdOffset, SEEK_SET);
    char fileName[65536];
    for (auto i = 0L; i < entryCount; i++) {
        auto const cd = f_.Read<CentralDirEntry>();
        auto const rc = f_.Read(&fileName, cd.nameLen);
        fileName[rc] = 0;
        f_.seek(cd.nameLen - rc, SEEK_CUR);
        int64_t offset = cd.offset;
        int exLen = cd.exLen;
        Extra extra{};
        while (exLen > 0) {
            f_.Read((uint8_t*)&extra, 4);
            f_.Read(extra.data, extra.size);
            if (extra.id == 0x01) {
                offset = extra.zip64.offset;
            } else if (extra.id == 0x7875) {
                auto const* ptr = &extra.data[1];
                uint32_t const uid = decodeInt(&ptr);
                uint32_t const gid = decodeInt(&ptr);
                printf("UID %x GID %x\n", uid, gid);
            } else if (extra.id == 0x5455) {
                // TODO: Read timestamps
            } else
                printf("**Warning: Ignoring extra block %04x\n", extra.id);

            exLen -= (extra.size + 4);
        }

        f_.seek(cd.commLen, SEEK_CUR);
        auto const flags = ((cd.attr1 & (S_IFREG >> 16)) == 0)
                               ? // Some archives have broken attributes
                               0
                               : cd.attr1 >> 16;
        entries_.emplace_back(fileName, offset, flags);
    }
}